

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZDICT_tryMerge(dictItem *table,dictItem elt,U32 eltNbToSkip,void *buffer)

{
  dictItem *pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 UVar5;
  U32 UVar6;
  U32 UVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  dictItem *pdVar14;
  ulong uVar15;
  uint uVar16;
  char *into;
  ulong uVar17;
  long *plVar18;
  uint uVar19;
  ulong uVar20;
  
  uVar16 = elt.savings;
  uVar9 = (ulong)table->pos;
  if (1 < uVar9) {
    uVar17 = elt._0_8_ >> 0x20;
    uVar11 = elt.pos;
    uVar4 = elt.length;
    uVar12 = uVar11 + uVar4;
    pdVar14 = table + 1;
    uVar15 = 0;
    do {
      if ((ulong)eltNbToSkip - 1 != uVar15) {
        uVar13 = pdVar14->pos;
        iVar10 = uVar13 - uVar11;
        if (uVar13 <= uVar12 && (uVar11 <= uVar13 && iVar10 != 0)) {
          pdVar14->length = pdVar14->length + iVar10;
          pdVar14->pos = uVar11;
          uVar16 = (uVar4 >> 3) + (int)((uVar16 * iVar10) / uVar17) + pdVar14->savings;
          uVar8 = uVar15 + 1;
          pdVar14->savings = uVar16;
          UVar6 = pdVar14->pos;
          UVar7 = pdVar14->length;
          if (uVar8 < 2) goto LAB_001df33b;
          goto LAB_001df2bd;
        }
      }
      uVar15 = uVar15 + 1;
      pdVar14 = pdVar14 + 1;
    } while (uVar9 - 1 != uVar15);
    if (1 < table->pos) {
      plVar18 = (long *)((long)buffer + (ulong)uVar11 + 1);
      pdVar14 = table + 1;
      uVar8 = 1;
      uVar13 = 0;
      do {
        if (uVar8 != eltNbToSkip) {
          pdVar1 = table + uVar8;
          uVar2 = pdVar1->pos;
          uVar3 = pdVar1->length;
          uVar15 = (ulong)uVar3;
          uVar19 = uVar3 + uVar2;
          if (uVar2 < uVar11 && uVar11 <= uVar19) {
            uVar11 = (uVar4 >> 3) + pdVar1->savings;
            pdVar1->savings = uVar11;
            iVar10 = uVar12 - uVar19;
            if (iVar10 != 0 && (int)uVar19 <= (int)uVar12) {
              pdVar1->length = uVar3 + iVar10;
              uVar11 = uVar11 + (int)((uVar16 * iVar10) / uVar17);
              pdVar1->savings = uVar11;
            }
            UVar6 = pdVar1->pos;
            UVar7 = pdVar1->length;
            if (uVar8 < 2) goto LAB_001df3cb;
            goto LAB_001df38a;
          }
          if (*(long *)((long)buffer + (ulong)uVar2) == *plVar18) {
            if (uVar15 == 0) {
              uVar20 = 0;
            }
            else {
              uVar20 = 0;
              while (*(char *)((long)buffer + uVar20 + uVar2) == *(char *)((long)plVar18 + uVar20))
              {
                uVar20 = uVar20 + 1;
                if (uVar15 == uVar20) goto LAB_001df2f9;
              }
            }
            if (uVar20 == uVar15) {
LAB_001df2f9:
              uVar9 = 1;
              if (1 < (int)(uVar4 - uVar3)) {
                uVar9 = (ulong)(uVar4 - uVar3);
              }
              pdVar1->pos = uVar11;
              pdVar1->savings = pdVar1->savings + (int)((uVar16 * uVar9) / uVar17);
              uVar16 = uVar3 + 1;
              if (uVar4 <= uVar3 + 1) {
                uVar16 = uVar4;
              }
              pdVar1->length = uVar16;
              goto LAB_001df283;
            }
          }
        }
        uVar8 = uVar8 + 1;
        uVar13 = uVar13 + 1;
        pdVar14 = pdVar14 + 1;
      } while (uVar8 != uVar9);
    }
  }
  uVar8 = 0;
  goto LAB_001df283;
  while( true ) {
    pdVar1 = table + (uVar15 & 0xffffffff);
    pdVar14->savings = pdVar1->savings;
    UVar5 = pdVar1->length;
    pdVar14->pos = pdVar1->pos;
    pdVar14->length = UVar5;
    pdVar14 = pdVar14 + -1;
    uVar9 = uVar15 & 0xfffffffe;
    uVar15 = uVar15 - 1;
    if (uVar9 == 0) break;
LAB_001df2bd:
    if (uVar16 <= table[uVar15 & 0xffffffff].savings) {
      uVar8 = (ulong)((int)uVar15 + 1);
      goto LAB_001df33b;
    }
  }
  uVar8 = 1;
LAB_001df33b:
  table[uVar8 & 0xffffffff].pos = UVar6;
  table[uVar8 & 0xffffffff].length = UVar7;
  table[uVar8 & 0xffffffff].savings = uVar16;
  goto LAB_001df283;
  while( true ) {
    pdVar1 = table + uVar13;
    pdVar14->savings = pdVar1->savings;
    UVar5 = pdVar1->length;
    pdVar14->pos = pdVar1->pos;
    pdVar14->length = UVar5;
    pdVar14 = pdVar14 + -1;
    uVar16 = uVar13 & 0xfffffffe;
    uVar13 = uVar13 - 1;
    if (uVar16 == 0) break;
LAB_001df38a:
    if (uVar11 <= table[uVar13].savings) {
      uVar8 = (ulong)(uVar13 + 1);
      goto LAB_001df3cb;
    }
  }
  uVar8 = 1;
LAB_001df3cb:
  table[uVar8 & 0xffffffff].pos = UVar6;
  table[uVar8 & 0xffffffff].length = UVar7;
  table[uVar8 & 0xffffffff].savings = uVar11;
LAB_001df283:
  return (U32)uVar8;
}

Assistant:

static U32 ZDICT_tryMerge(dictItem* table, dictItem elt, U32 eltNbToSkip, const void* buffer)
{
    const U32 tableSize = table->pos;
    const U32 eltEnd = elt.pos + elt.length;
    const char* const buf = (const char*) buffer;

    /* tail overlap */
    U32 u; for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;
        if ((table[u].pos > elt.pos) && (table[u].pos <= eltEnd)) {  /* overlap, existing > new */
            /* append */
            U32 const addedLength = table[u].pos - elt.pos;
            table[u].length += addedLength;
            table[u].pos = elt.pos;
            table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            elt = table[u];
            /* sort : improve rank */
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
    }   }

    /* front overlap */
    for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;

        if ((table[u].pos + table[u].length >= elt.pos) && (table[u].pos < elt.pos)) {  /* overlap, existing < new */
            /* append */
            int const addedLength = (int)eltEnd - (int)(table[u].pos + table[u].length);
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            if (addedLength > 0) {   /* otherwise, elt fully included into existing */
                table[u].length += addedLength;
                table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            }
            /* sort : improve rank */
            elt = table[u];
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
        }

        if (MEM_read64(buf + table[u].pos) == MEM_read64(buf + elt.pos + 1)) {
            if (isIncluded(buf + table[u].pos, buf + elt.pos + 1, table[u].length)) {
                size_t const addedLength = MAX( (int)elt.length - (int)table[u].length , 1 );
                table[u].pos = elt.pos;
                table[u].savings += (U32)(elt.savings * addedLength / elt.length);
                table[u].length = MIN(elt.length, table[u].length + 1);
                return u;
            }
        }
    }

    return 0;
}